

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O2

void iutest::TestEnv::set_stream_result_to(char *str)

{
  Variable *pVVar1;
  char *__s;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  __s = "";
  if (str != (char *)0x0) {
    __s = str;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,__s,&local_29);
  pVVar1 = get_vars();
  StateVariable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&pVVar1->m_stream_result_to,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static bool IsEnableFlag(int flag) { return (GetInstance().m_test_flags & flag) ? true : false; }